

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O0

cl_platform_id __thiscall CLIntercept::getPlatform(CLIntercept *this,cl_command_queue queue)

{
  cl_icd_dispatch *pcVar1;
  cl_platform_id p_Var2;
  cl_command_queue in_RSI;
  CLIntercept *in_RDI;
  cl_device_id device;
  cl_device_id in_stack_ffffffffffffffd8;
  undefined8 local_18;
  cl_command_queue local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  pcVar1 = dispatch(in_RDI);
  (*pcVar1->clGetCommandQueueInfo)(local_10,0x1091,8,&local_18,(size_t *)0x0);
  p_Var2 = getPlatform(in_RDI,in_stack_ffffffffffffffd8);
  return p_Var2;
}

Assistant:

inline cl_platform_id CLIntercept::getPlatform( cl_command_queue queue ) const
{
    cl_device_id device = NULL;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL );
    return getPlatform(device);
}